

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

cio_error cio_timer_expires_from_now
                    (cio_timer *timer,uint64_t timeout_ns,cio_timer_handler_t handler,
                    void *handler_context)

{
  int iVar1;
  int *piVar2;
  cio_error cVar3;
  itimerspec timeout;
  itimerspec local_38;
  
  local_38.it_value.tv_sec = timeout_ns / 1000000000;
  local_38.it_value.tv_nsec = timeout_ns % 1000000000;
  local_38.it_interval.tv_sec = 0;
  local_38.it_interval.tv_nsec = 0;
  timer->handler = handler;
  timer->handler_context = handler_context;
  (timer->impl).ev.context = timer;
  cVar3 = CIO_SUCCESS;
  iVar1 = timerfd_settime((timer->impl).ev.fd,0,&local_38,(itimerspec *)0x0);
  if (iVar1 == 0) {
    timer_read(timer,CIO_EPOLL_SUCCESS);
  }
  else {
    piVar2 = __errno_location();
    cVar3 = -*piVar2;
  }
  return cVar3;
}

Assistant:

enum cio_error cio_timer_expires_from_now(struct cio_timer *timer, uint64_t timeout_ns, cio_timer_handler_t handler, void *handler_context)
{
	struct itimerspec timeout = convert_timeoutns_to_itimerspec(timeout_ns);

	timer->handler = handler;
	timer->handler_context = handler_context;
	timer->impl.ev.context = timer;

	int ret = timerfd_settime(timer->impl.ev.fd, 0, &timeout, NULL);
	if (cio_unlikely(ret != 0)) {
		return (enum cio_error)(-errno);
	}

	timer_read(timer, CIO_EPOLL_SUCCESS);
	return CIO_SUCCESS;
}